

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *b;
  float fVar1;
  undefined4 uVar2;
  int _elempack;
  int iVar3;
  uint uVar4;
  Mat *this_00;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  undefined1 (*pauVar44) [16];
  int y_32;
  uint uVar45;
  undefined1 (*pauVar46) [16];
  void *pvVar47;
  uint uVar48;
  int iVar49;
  ulong uVar50;
  Mat *pMVar51;
  undefined1 (*pauVar52) [16];
  Mat *a;
  int y;
  long lVar53;
  uint uVar54;
  void *pvVar55;
  uint uVar56;
  float *pfVar57;
  float *pfVar58;
  bool bVar59;
  float fVar60;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  __m128 afVar109;
  binary_op_pow op;
  float *local_b0;
  float *local_90;
  float *local_88;
  __m128 _p1;
  __m128 _a0;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar34 = a->elempack;
  _elempack = a[1].elempack;
  if ((_elempack != 4 && iVar34 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar34 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar34;
  }
  b = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar45 = a->w;
    uVar56 = a->h;
    iVar3 = a->d;
    uVar35 = a->c;
    uVar38 = (ulong)uVar35;
    iVar43 = uVar56 * uVar45 * iVar3;
    sVar5 = a->elemsize;
    uVar54 = a[1].w;
    uVar48 = a[1].h;
    iVar49 = a[1].d;
    uVar4 = a[1].c;
    uVar37 = (ulong)uVar4;
    iVar42 = uVar48 * uVar54 * iVar49;
    sVar6 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar45 == 1) {
        Mat::create_like(this_00,b,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pvVar8 = a[1].data;
            fVar1 = *a->data;
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)(sVar5 * uVar38 * sVar6 + (long)pvVar8);
            pvVar47 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar46 = (undefined1 (*) [16])(sVar10 * uVar38 * sVar9 + (long)pvVar47);
            lVar53 = 0;
            for (iVar34 = 0; iVar34 + 3 < iVar42 * _elempack; iVar34 = iVar34 + 4) {
              auVar107._0_4_ = *pfVar57 + fVar1;
              auVar107._4_4_ = pfVar57[1] + fVar1;
              auVar107._8_4_ = pfVar57[2] + fVar1;
              auVar107._12_4_ = pfVar57[3] + fVar1;
              *pauVar46 = auVar107;
              pfVar57 = pfVar57 + 4;
              pauVar46 = pauVar46 + 1;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar42 * _elempack; lVar53 = lVar53 + 1) {
              *(float *)((long)pvVar47 + lVar53 * 4 + sVar10 * sVar9 * uVar38) =
                   *(float *)((long)pvVar8 + lVar53 * 4 + sVar5 * sVar6 * uVar38) + fVar1;
            }
          }
          return 0;
        }
        return -100;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0036b6ec_caseD_1;
      case 2:
        Mat::create(this_00,uVar54,uVar48,sVar6,_elempack,opt->blob_allocator);
        pauVar46 = (undefined1 (*) [16])this_00->data;
        if (pauVar46 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          pfVar57 = (float *)a->data;
          pfVar58 = (float *)a[1].data;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            uVar56 = uVar54;
            while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
              auVar88._0_4_ = *pfVar58 + fVar1;
              auVar88._4_4_ = pfVar58[1] + fVar60;
              auVar88._8_4_ = pfVar58[2] + fVar32;
              auVar88._12_4_ = pfVar58[3] + fVar33;
              *pauVar46 = auVar88;
              pfVar58 = pfVar58 + 4;
              pauVar46 = pauVar46 + 1;
            }
            pfVar57 = pfVar57 + 4;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              auVar86._0_4_ = *pfVar57 + fVar1;
              auVar86._4_4_ = pfVar57[1] + fVar60;
              auVar86._8_4_ = pfVar57[2] + fVar32;
              auVar86._12_4_ = pfVar57[3] + fVar33;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar86;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              auVar87._0_4_ = *pfVar57 + fVar1;
              auVar87._4_4_ = pfVar57[1] + fVar60;
              auVar87._8_4_ = pfVar57[2] + fVar32;
              auVar87._12_4_ = pfVar57[3] + fVar33;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar87;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              uVar56 = uVar54;
              while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                auVar73._0_4_ = *pfVar58 + fVar1;
                auVar73._4_4_ = pfVar58[1] + fVar60;
                auVar73._8_4_ = pfVar58[2] + fVar32;
                auVar73._12_4_ = pfVar58[3] + fVar33;
                *pauVar46 = auVar73;
                pfVar58 = pfVar58 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar57 = pfVar57 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              for (uVar45 = 0; uVar56 = uVar54, uVar45 != uVar48; uVar45 = uVar45 + 1) {
                while (uVar56 != 0) {
                  auVar66._0_4_ = *pfVar58 + fVar1;
                  auVar66._4_4_ = pfVar58[1] + fVar60;
                  auVar66._8_4_ = pfVar58[2] + fVar32;
                  auVar66._12_4_ = pfVar58[3] + fVar33;
                  *pauVar46 = auVar66;
                  pfVar58 = pfVar58 + 4;
                  pauVar46 = pauVar46 + 1;
                  uVar56 = uVar56 - 1;
                }
              }
              pfVar57 = pfVar57 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
LAB_0036ab62:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>(a,b,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,opt->blob_allocator);
      pauVar46 = (undefined1 (*) [16])this_00->data;
      if (pauVar46 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || a[1].w != 1) {
        pfVar57 = (float *)a->data;
        pfVar58 = (float *)a[1].data;
        if ((int)uVar45 < 1) {
          uVar45 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar56 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
          fVar1 = *pfVar58;
          fVar60 = pfVar58[1];
          fVar32 = pfVar58[2];
          fVar33 = pfVar58[3];
          uVar54 = uVar45;
          while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
            auVar104._0_4_ = *pfVar57 + fVar1;
            auVar104._4_4_ = pfVar57[1] + fVar60;
            auVar104._8_4_ = pfVar57[2] + fVar32;
            auVar104._12_4_ = pfVar57[3] + fVar33;
            *pauVar46 = auVar104;
            pfVar57 = pfVar57 + 4;
            pauVar46 = pauVar46 + 1;
          }
          pfVar58 = pfVar58 + 4;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar36 = uVar4 ^ uVar35;
        if (((uVar54 ^ 1) == 0 && (uVar48 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a->cstep;
              sVar9 = a->elemsize;
              pvVar8 = a->data;
              pfVar57 = (float *)((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              sVar10 = this_00->elemsize;
              pvVar47 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37);
                auVar71._0_4_ = *pfVar57 + fVar1;
                auVar71._4_4_ = pfVar57[1] + fVar60;
                auVar71._8_4_ = pfVar57[2] + fVar32;
                auVar71._12_4_ = pfVar57[3] + fVar33;
                *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37) = auVar71;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar54 == uVar45) && (_elempack == 1 && (uVar4 == 1 && uVar48 == uVar56))) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a[1].data;
              pvVar47 = a->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar37);
                fVar1 = *(float *)((long)pvVar8 + lVar53);
                auVar78._0_4_ = fVar1 + *pfVar57;
                auVar78._4_4_ = fVar1 + pfVar57[1];
                auVar78._8_4_ = fVar1 + pfVar57[2];
                auVar78._12_4_ = fVar1 + pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar37) =
                     auVar78;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar45 ^ 1) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar54,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = this_00->elemsize;
              sVar9 = a[1].cstep;
              pvVar8 = this_00->data;
              pfVar57 = (float *)((long)a->data + a->cstep * uVar37 * a->elemsize);
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              sVar10 = a[1].elemsize;
              pvVar47 = a[1].data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37);
                auVar82._0_4_ = *pfVar57 + fVar1;
                auVar82._4_4_ = pfVar57[1] + fVar60;
                auVar82._8_4_ = pfVar57[2] + fVar32;
                auVar82._12_4_ = pfVar57[3] + fVar33;
                *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37) = auVar82;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 == uVar45) && (iVar34 == 1)) && (uVar48 == uVar56)) && (uVar35 == 1)) {
          Mat::create(this_00,uVar45,uVar56,uVar4,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a->data;
              pvVar47 = a[1].data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                fVar1 = *(float *)((long)pvVar8 + lVar53);
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
                auVar90._0_4_ = *pfVar57 + fVar1;
                auVar90._4_4_ = pfVar57[1] + fVar1;
                auVar90._8_4_ = pfVar57[2] + fVar1;
                auVar90._12_4_ = pfVar57[3] + fVar1;
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar90;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar45 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              pfVar57 = (float *)(a->cstep * uVar39 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar56 = uVar45;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar94._0_4_ = *pfVar57 + fVar1;
                  auVar94._4_4_ = pfVar57[1] + fVar60;
                  auVar94._8_4_ = pfVar57[2] + fVar32;
                  auVar94._12_4_ = pfVar57[3] + fVar33;
                  *pauVar46 = auVar94;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar48 ^ 1) == 0 && (uVar54 ^ uVar45) == 0) && uVar36 == 0) && uVar56 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar56 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              pvVar47 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  pfVar57 = (float *)((long)pvVar47 + lVar53);
                  pfVar58 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
                  auVar98._0_4_ = *pfVar58 + *pfVar57;
                  auVar98._4_4_ = pfVar58[1] + pfVar57[1];
                  auVar98._8_4_ = pfVar58[2] + pfVar57[2];
                  auVar98._12_4_ = pfVar58[3] + pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar98;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar45 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar56,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar54 < 1) {
              uVar54 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              pfVar57 = (float *)(a[1].cstep * uVar39 * a[1].elemsize + (long)a[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar45 = uVar54;
                while (bVar59 = uVar45 != 0, uVar45 = uVar45 - 1, bVar59) {
                  auVar102._0_4_ = *pfVar57 + fVar1;
                  auVar102._4_4_ = pfVar57[1] + fVar60;
                  auVar102._8_4_ = pfVar57[2] + fVar32;
                  auVar102._12_4_ = pfVar57[3] + fVar33;
                  *pauVar46 = auVar102;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ uVar45) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) && uVar48 != 1) {
          Mat::create(this_00,uVar45,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              pvVar47 = (void *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              for (uVar56 = 0; uVar56 != uVar48; uVar56 = uVar56 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
                  pfVar58 = (float *)((long)pvVar47 + lVar53);
                  auVar106._0_4_ = *pfVar58 + *pfVar57;
                  auVar106._4_4_ = pfVar58[1] + pfVar57[1];
                  auVar106._8_4_ = pfVar58[2] + pfVar57[2];
                  auVar106._12_4_ = pfVar58[3] + pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar106;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0036ab62;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                fVar1 = *pfVar57;
                fVar60 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                uVar56 = uVar54;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar64._0_4_ = *pfVar58 + fVar1;
                  auVar64._4_4_ = pfVar58[1] + fVar60;
                  auVar64._8_4_ = pfVar58[2] + fVar32;
                  auVar64._12_4_ = pfVar58[3] + fVar33;
                  *pauVar46 = auVar64;
                  pfVar58 = pfVar58 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                pfVar57 = pfVar57 + 4;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
              fVar1 = *pfVar58;
              fVar60 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              uVar54 = uVar45;
              while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                auVar75._0_4_ = *pfVar57 + fVar1;
                auVar75._4_4_ = pfVar57[1] + fVar60;
                auVar75._8_4_ = pfVar57[2] + fVar32;
                auVar75._12_4_ = pfVar57[3] + fVar33;
                *pauVar46 = auVar75;
                pfVar57 = pfVar57 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar58 = pfVar58 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          pfVar57 = (float *)((long)a[1].data + uVar37 * 0x10);
          fVar1 = *pfVar57;
          fVar60 = pfVar57[1];
          fVar32 = pfVar57[2];
          fVar33 = pfVar57[3];
          pvVar8 = a->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
            auVar100._0_4_ = *pfVar57 + fVar1;
            auVar100._4_4_ = pfVar57[1] + fVar60;
            auVar100._8_4_ = pfVar57[2] + fVar32;
            auVar100._12_4_ = pfVar57[3] + fVar33;
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37) = auVar100;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_0036ab62;
      Mat::create(this_00,uVar45,uVar56,iVar3,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar54 = uVar45;
                while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                  auVar92._0_4_ = *pfVar57 + fVar1;
                  auVar92._4_4_ = pfVar57[1] + fVar60;
                  auVar92._8_4_ = pfVar57[2] + fVar32;
                  auVar92._12_4_ = pfVar57[3] + fVar33;
                  *pauVar46 = auVar92;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                pfVar58 = pfVar58 + 4;
              }
            }
          }
          return 0;
        }
        if (iVar34 == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              fVar1 = *pfVar58;
              fVar60 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              for (uVar35 = 0; uVar54 = uVar45, uVar35 != uVar56; uVar35 = uVar35 + 1) {
                while (uVar54 != 0) {
                  auVar68._0_4_ = *pfVar57 + fVar1;
                  auVar68._4_4_ = pfVar57[1] + fVar60;
                  auVar68._8_4_ = pfVar57[2] + fVar32;
                  auVar68._12_4_ = pfVar57[3] + fVar33;
                  *pauVar46 = auVar68;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                  uVar54 = uVar54 - 1;
                }
              }
              pfVar58 = pfVar58 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = this_00->cstep;
          sVar9 = this_00->elemsize;
          pvVar8 = this_00->data;
          pfVar57 = (float *)((long)a[1].data + uVar37 * 0x10);
          fVar1 = *pfVar57;
          fVar60 = pfVar57[1];
          fVar32 = pfVar57[2];
          fVar33 = pfVar57[3];
          sVar10 = a->elemsize;
          pvVar47 = a->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37);
            auVar96._0_4_ = *pfVar57 + fVar1;
            auVar96._4_4_ = pfVar57[1] + fVar60;
            auVar96._8_4_ = pfVar57[2] + fVar32;
            auVar96._12_4_ = pfVar57[3] + fVar33;
            *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37) = auVar96;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_0036f5ed:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_add>(a,b,this_00,opt);
    return iVar34;
  case 1:
    pMVar51 = b;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar45 = a->w;
    uVar56 = a->h;
    iVar3 = a->d;
    uVar35 = a->c;
    uVar38 = (ulong)uVar35;
    iVar43 = uVar56 * uVar45 * iVar3;
    sVar5 = a->elemsize;
    uVar54 = a[1].w;
    uVar48 = a[1].h;
    iVar49 = a[1].d;
    uVar4 = a[1].c;
    uVar37 = (ulong)uVar4;
    iVar42 = uVar48 * uVar54 * iVar49;
    sVar6 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar45 == 1) {
        Mat::create_like(this_00,b,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pvVar8 = a[1].data;
            fVar1 = *a->data;
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)(sVar5 * uVar38 * sVar6 + (long)pvVar8);
            pvVar47 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar46 = (undefined1 (*) [16])(sVar10 * uVar38 * sVar9 + (long)pvVar47);
            lVar53 = 0;
            for (iVar34 = 0; iVar34 + 3 < iVar42 * _elempack; iVar34 = iVar34 + 4) {
              auVar108._0_4_ = *pfVar57 * fVar1;
              auVar108._4_4_ = pfVar57[1] * fVar1;
              auVar108._8_4_ = pfVar57[2] * fVar1;
              auVar108._12_4_ = pfVar57[3] * fVar1;
              *pauVar46 = auVar108;
              pfVar57 = pfVar57 + 4;
              pauVar46 = pauVar46 + 1;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar42 * _elempack; lVar53 = lVar53 + 1) {
              *(float *)((long)pvVar47 + lVar53 * 4 + sVar10 * sVar9 * uVar38) =
                   *(float *)((long)pvVar8 + lVar53 * 4 + sVar5 * sVar6 * uVar38) * fVar1;
            }
          }
          return 0;
        }
        return -100;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0036b515_caseD_1;
      case 2:
        Mat::create(this_00,uVar54,uVar48,sVar6,_elempack,opt->blob_allocator);
        pauVar46 = (undefined1 (*) [16])this_00->data;
        if (pauVar46 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          pfVar57 = (float *)a->data;
          pfVar58 = (float *)a[1].data;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            uVar56 = uVar54;
            while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
              auVar85._0_4_ = *pfVar58 * fVar1;
              auVar85._4_4_ = pfVar58[1] * fVar60;
              auVar85._8_4_ = pfVar58[2] * fVar32;
              auVar85._12_4_ = pfVar58[3] * fVar33;
              *pauVar46 = auVar85;
              pfVar58 = pfVar58 + 4;
              pauVar46 = pauVar46 + 1;
            }
            pfVar57 = pfVar57 + 4;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              auVar83._0_4_ = *pfVar57 * fVar1;
              auVar83._4_4_ = pfVar57[1] * fVar60;
              auVar83._8_4_ = pfVar57[2] * fVar32;
              auVar83._12_4_ = pfVar57[3] * fVar33;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar83;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            fVar1 = *pfVar57;
            fVar60 = pfVar57[1];
            fVar32 = pfVar57[2];
            fVar33 = pfVar57[3];
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              auVar84._0_4_ = *pfVar57 * fVar1;
              auVar84._4_4_ = pfVar57[1] * fVar60;
              auVar84._8_4_ = pfVar57[2] * fVar32;
              auVar84._12_4_ = pfVar57[3] * fVar33;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar84;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              uVar56 = uVar54;
              while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                auVar72._0_4_ = *pfVar58 * fVar1;
                auVar72._4_4_ = pfVar58[1] * fVar60;
                auVar72._8_4_ = pfVar58[2] * fVar32;
                auVar72._12_4_ = pfVar58[3] * fVar33;
                *pauVar46 = auVar72;
                pfVar58 = pfVar58 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar57 = pfVar57 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              for (uVar45 = 0; uVar56 = uVar54, uVar45 != uVar48; uVar45 = uVar45 + 1) {
                while (uVar56 != 0) {
                  auVar65._0_4_ = *pfVar58 * fVar1;
                  auVar65._4_4_ = pfVar58[1] * fVar60;
                  auVar65._8_4_ = pfVar58[2] * fVar32;
                  auVar65._12_4_ = pfVar58[3] * fVar33;
                  *pauVar46 = auVar65;
                  pfVar58 = pfVar58 + 4;
                  pauVar46 = pauVar46 + 1;
                  uVar56 = uVar56 - 1;
                }
              }
              pfVar57 = pfVar57 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
LAB_0036a916:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>(a,b,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,opt->blob_allocator);
      pauVar46 = (undefined1 (*) [16])this_00->data;
      if (pauVar46 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || a[1].w != 1) {
        pfVar57 = (float *)a->data;
        pfVar58 = (float *)a[1].data;
        if ((int)uVar45 < 1) {
          uVar45 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar56 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
          fVar1 = *pfVar58;
          fVar60 = pfVar58[1];
          fVar32 = pfVar58[2];
          fVar33 = pfVar58[3];
          uVar54 = uVar45;
          while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
            auVar103._0_4_ = *pfVar57 * fVar1;
            auVar103._4_4_ = pfVar57[1] * fVar60;
            auVar103._8_4_ = pfVar57[2] * fVar32;
            auVar103._12_4_ = pfVar57[3] * fVar33;
            *pauVar46 = auVar103;
            pfVar57 = pfVar57 + 4;
            pauVar46 = pauVar46 + 1;
          }
          pfVar58 = pfVar58 + 4;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar36 = uVar4 ^ uVar35;
        if (((uVar54 ^ 1) == 0 && (uVar48 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a->cstep;
              sVar9 = a->elemsize;
              pvVar8 = a->data;
              pfVar57 = (float *)((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              sVar10 = this_00->elemsize;
              pvVar47 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37);
                auVar70._0_4_ = *pfVar57 * fVar1;
                auVar70._4_4_ = pfVar57[1] * fVar60;
                auVar70._8_4_ = pfVar57[2] * fVar32;
                auVar70._12_4_ = pfVar57[3] * fVar33;
                *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37) = auVar70;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar54 == uVar45) && (_elempack == 1 && (uVar4 == 1 && uVar48 == uVar56))) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a[1].data;
              pvVar47 = a->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar37);
                fVar1 = *(float *)((long)pvVar8 + lVar53);
                auVar77._0_4_ = fVar1 * *pfVar57;
                auVar77._4_4_ = fVar1 * pfVar57[1];
                auVar77._8_4_ = fVar1 * pfVar57[2];
                auVar77._12_4_ = fVar1 * pfVar57[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar37) =
                     auVar77;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar45 ^ 1) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar54,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = this_00->elemsize;
              sVar9 = a[1].cstep;
              pvVar8 = this_00->data;
              pfVar57 = (float *)((long)a->data + a->cstep * uVar37 * a->elemsize);
              fVar1 = *pfVar57;
              fVar60 = pfVar57[1];
              fVar32 = pfVar57[2];
              fVar33 = pfVar57[3];
              sVar10 = a[1].elemsize;
              pvVar47 = a[1].data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37);
                auVar81._0_4_ = *pfVar57 * fVar1;
                auVar81._4_4_ = pfVar57[1] * fVar60;
                auVar81._8_4_ = pfVar57[2] * fVar32;
                auVar81._12_4_ = pfVar57[3] * fVar33;
                *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37) = auVar81;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar54 == uVar45) && (iVar34 == 1)) && ((uVar48 == uVar56 && (uVar35 == 1)))) {
          Mat::create(this_00,uVar45,uVar56,uVar4,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a->data;
              pvVar47 = a[1].data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                fVar1 = *(float *)((long)pvVar8 + lVar53);
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
                auVar89._0_4_ = *pfVar57 * fVar1;
                auVar89._4_4_ = pfVar57[1] * fVar1;
                auVar89._8_4_ = pfVar57[2] * fVar1;
                auVar89._12_4_ = pfVar57[3] * fVar1;
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar89;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar45 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              pfVar57 = (float *)(a->cstep * uVar39 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar56 = uVar45;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar93._0_4_ = *pfVar57 * fVar1;
                  auVar93._4_4_ = pfVar57[1] * fVar60;
                  auVar93._8_4_ = pfVar57[2] * fVar32;
                  auVar93._12_4_ = pfVar57[3] * fVar33;
                  *pauVar46 = auVar93;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar48 ^ 1) == 0 && (uVar54 ^ uVar45) == 0) && uVar36 == 0) && uVar56 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar56 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              pvVar47 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  pfVar57 = (float *)((long)pvVar47 + lVar53);
                  pfVar58 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
                  auVar97._0_4_ = *pfVar58 * *pfVar57;
                  auVar97._4_4_ = pfVar58[1] * pfVar57[1];
                  auVar97._8_4_ = pfVar58[2] * pfVar57[2];
                  auVar97._12_4_ = pfVar58[3] * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar97;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar45 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar56,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar54 < 1) {
              uVar54 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              pfVar57 = (float *)(a[1].cstep * uVar39 * a[1].elemsize + (long)a[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar45 = uVar54;
                while (bVar59 = uVar45 != 0, uVar45 = uVar45 - 1, bVar59) {
                  auVar101._0_4_ = *pfVar57 * fVar1;
                  auVar101._4_4_ = pfVar57[1] * fVar60;
                  auVar101._8_4_ = pfVar57[2] * fVar32;
                  auVar101._12_4_ = pfVar57[3] * fVar33;
                  *pauVar46 = auVar101;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ uVar45) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) && uVar48 != 1) {
          Mat::create(this_00,uVar45,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              pvVar47 = (void *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              for (uVar56 = 0; uVar56 != uVar48; uVar56 = uVar56 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
                  pfVar58 = (float *)((long)pvVar47 + lVar53);
                  auVar105._0_4_ = *pfVar58 * *pfVar57;
                  auVar105._4_4_ = pfVar58[1] * pfVar57[1];
                  auVar105._8_4_ = pfVar58[2] * pfVar57[2];
                  auVar105._12_4_ = pfVar58[3] * pfVar57[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar105;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0036a916;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                fVar1 = *pfVar57;
                fVar60 = pfVar57[1];
                fVar32 = pfVar57[2];
                fVar33 = pfVar57[3];
                uVar56 = uVar54;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar63._0_4_ = *pfVar58 * fVar1;
                  auVar63._4_4_ = pfVar58[1] * fVar60;
                  auVar63._8_4_ = pfVar58[2] * fVar32;
                  auVar63._12_4_ = pfVar58[3] * fVar33;
                  *pauVar46 = auVar63;
                  pfVar58 = pfVar58 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                pfVar57 = pfVar57 + 4;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
              fVar1 = *pfVar58;
              fVar60 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              uVar54 = uVar45;
              while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                auVar74._0_4_ = *pfVar57 * fVar1;
                auVar74._4_4_ = pfVar57[1] * fVar60;
                auVar74._8_4_ = pfVar57[2] * fVar32;
                auVar74._12_4_ = pfVar57[3] * fVar33;
                *pauVar46 = auVar74;
                pfVar57 = pfVar57 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar58 = pfVar58 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          pfVar57 = (float *)((long)a[1].data + uVar37 * 0x10);
          fVar1 = *pfVar57;
          fVar60 = pfVar57[1];
          fVar32 = pfVar57[2];
          fVar33 = pfVar57[3];
          pvVar8 = a->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37);
            auVar99._0_4_ = *pfVar57 * fVar1;
            auVar99._4_4_ = pfVar57[1] * fVar60;
            auVar99._8_4_ = pfVar57[2] * fVar32;
            auVar99._12_4_ = pfVar57[3] * fVar33;
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37) = auVar99;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_0036a916;
      Mat::create(this_00,uVar45,uVar56,iVar3,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                fVar1 = *pfVar58;
                fVar60 = pfVar58[1];
                fVar32 = pfVar58[2];
                fVar33 = pfVar58[3];
                uVar54 = uVar45;
                while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                  auVar91._0_4_ = *pfVar57 * fVar1;
                  auVar91._4_4_ = pfVar57[1] * fVar60;
                  auVar91._8_4_ = pfVar57[2] * fVar32;
                  auVar91._12_4_ = pfVar57[3] * fVar33;
                  *pauVar46 = auVar91;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                pfVar58 = pfVar58 + 4;
              }
            }
          }
          return 0;
        }
        if (iVar34 == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pfVar57 = (float *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pfVar58 = (float *)((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              fVar1 = *pfVar58;
              fVar60 = pfVar58[1];
              fVar32 = pfVar58[2];
              fVar33 = pfVar58[3];
              for (uVar35 = 0; uVar54 = uVar45, uVar35 != uVar56; uVar35 = uVar35 + 1) {
                while (uVar54 != 0) {
                  auVar67._0_4_ = *pfVar57 * fVar1;
                  auVar67._4_4_ = pfVar57[1] * fVar60;
                  auVar67._8_4_ = pfVar57[2] * fVar32;
                  auVar67._12_4_ = pfVar57[3] * fVar33;
                  *pauVar46 = auVar67;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                  uVar54 = uVar54 - 1;
                }
              }
              pfVar58 = pfVar58 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = this_00->cstep;
          sVar9 = this_00->elemsize;
          pvVar8 = this_00->data;
          pfVar57 = (float *)((long)a[1].data + uVar37 * 0x10);
          fVar1 = *pfVar57;
          fVar60 = pfVar57[1];
          fVar32 = pfVar57[2];
          fVar33 = pfVar57[3];
          sVar10 = a->elemsize;
          pvVar47 = a->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37);
            auVar95._0_4_ = *pfVar57 * fVar1;
            auVar95._4_4_ = pfVar57[1] * fVar60;
            auVar95._8_4_ = pfVar57[2] * fVar32;
            auVar95._12_4_ = pfVar57[3] * fVar33;
            *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37) = auVar95;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_0036f5b6:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_mul>(a,b,this_00,opt);
    return iVar34;
  case 3:
    pMVar51 = b;
    goto LAB_0036a58a;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar45 = a->w;
    uVar56 = a->h;
    iVar3 = a->d;
    uVar35 = a->c;
    uVar38 = (ulong)uVar35;
    iVar43 = uVar56 * uVar45 * iVar3;
    sVar5 = a->elemsize;
    uVar54 = a[1].w;
    uVar48 = a[1].h;
    iVar49 = a[1].d;
    uVar4 = a[1].c;
    uVar37 = (ulong)uVar4;
    iVar42 = uVar48 * uVar54 * iVar49;
    sVar6 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar45 == 1) {
        Mat::create_like(this_00,b,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pvVar8 = a[1].data;
            fVar1 = *a->data;
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pauVar44 = (undefined1 (*) [16])(sVar5 * uVar38 * sVar6 + (long)pvVar8);
            pvVar47 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar46 = (undefined1 (*) [16])(sVar10 * uVar38 * sVar9 + (long)pvVar47);
            auVar61._4_4_ = fVar1;
            auVar61._0_4_ = fVar1;
            auVar61._8_4_ = fVar1;
            auVar61._12_4_ = fVar1;
            lVar53 = 0;
            for (iVar34 = 0; iVar34 + 3 < iVar42 * _elempack; iVar34 = iVar34 + 4) {
              auVar80 = maxps(*pauVar44,auVar61);
              *pauVar46 = auVar80;
              pauVar44 = pauVar44 + 1;
              pauVar46 = pauVar46 + 1;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar42 * _elempack; lVar53 = lVar53 + 1) {
              fVar60 = *(float *)((long)pvVar8 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
              if (fVar60 <= fVar1) {
                fVar60 = fVar1;
              }
              *(float *)((long)pvVar47 + lVar53 * 4 + sVar10 * sVar9 * uVar38) = fVar60;
            }
          }
          return 0;
        }
        return -100;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0036b33e_caseD_1;
      case 2:
        Mat::create(this_00,uVar54,uVar48,sVar6,_elempack,opt->blob_allocator);
        pauVar46 = (undefined1 (*) [16])this_00->data;
        if (pauVar46 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          pauVar44 = (undefined1 (*) [16])a->data;
          pauVar52 = (undefined1 (*) [16])a[1].data;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
            auVar80 = *pauVar44;
            uVar56 = uVar54;
            while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
              auVar69 = maxps(*pauVar52,auVar80);
              *pauVar46 = auVar69;
              pauVar52 = pauVar52 + 1;
              pauVar46 = pauVar46 + 1;
            }
            pauVar44 = pauVar44 + 1;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            auVar80 = *(undefined1 (*) [16])((long)a->data + uVar38 * 0x10);
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              auVar69 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38)
                              ,auVar80);
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar69;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            auVar80 = *(undefined1 (*) [16])((long)a->data + uVar38 * 0x10);
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              auVar69 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38)
                              ,auVar80);
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar69;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
              auVar80 = *pauVar46;
              uVar56 = uVar54;
              while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                auVar69 = maxps(*pauVar44,auVar80);
                *pauVar52 = auVar69;
                pauVar44 = pauVar44 + 1;
                pauVar52 = pauVar52 + 1;
              }
              pauVar46 = pauVar46 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              auVar80 = *pauVar46;
              for (uVar45 = 0; uVar56 = uVar54, uVar45 != uVar48; uVar45 = uVar45 + 1) {
                while (uVar56 != 0) {
                  auVar69 = maxps(*pauVar44,auVar80);
                  *pauVar52 = auVar69;
                  pauVar44 = pauVar44 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar56 = uVar56 - 1;
                }
              }
              pauVar46 = pauVar46 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
LAB_0036a6ca:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>(a,b,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,opt->blob_allocator);
      pauVar46 = (undefined1 (*) [16])this_00->data;
      if (pauVar46 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || a[1].w != 1) {
        pauVar44 = (undefined1 (*) [16])a->data;
        pauVar52 = (undefined1 (*) [16])a[1].data;
        if ((int)uVar45 < 1) {
          uVar45 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar56 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
          auVar80 = *pauVar52;
          uVar54 = uVar45;
          while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
            auVar69 = maxps(*pauVar44,auVar80);
            *pauVar46 = auVar69;
            pauVar44 = pauVar44 + 1;
            pauVar46 = pauVar46 + 1;
          }
          pauVar52 = pauVar52 + 1;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar36 = uVar4 ^ uVar35;
        if (((uVar54 ^ 1) == 0 && (uVar48 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a->cstep;
              sVar9 = a->elemsize;
              pvVar8 = a->data;
              auVar80 = *(undefined1 (*) [16])
                         ((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
              sVar10 = this_00->elemsize;
              pvVar47 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                auVar69 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37),auVar80);
                *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37) = auVar69;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar54 == uVar45) && (_elempack == 1 && (uVar4 == 1 && uVar48 == uVar56))) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a[1].data;
              pvVar47 = a->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                uVar2 = *(undefined4 *)((long)pvVar8 + lVar53);
                auVar76._4_4_ = uVar2;
                auVar76._0_4_ = uVar2;
                auVar76._8_4_ = uVar2;
                auVar76._12_4_ = uVar2;
                auVar80 = maxps(auVar76,*(undefined1 (*) [16])
                                         ((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar37));
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar37) =
                     auVar80;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar45 ^ 1) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar54,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = this_00->elemsize;
              sVar9 = a[1].cstep;
              pvVar8 = this_00->data;
              auVar80 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar37 * a->elemsize);
              sVar10 = a[1].elemsize;
              pvVar47 = a[1].data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                auVar69 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37),auVar80);
                *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37) = auVar69;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 == uVar45) && (iVar34 == 1)) && (uVar48 == uVar56)) && (uVar35 == 1)) {
          Mat::create(this_00,uVar45,uVar56,uVar4,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a->data;
              pvVar47 = a[1].data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                uVar2 = *(undefined4 *)((long)pvVar8 + lVar53);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar80 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38),auVar28);
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar80;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar45 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              pauVar46 = (undefined1 (*) [16])(a->cstep * uVar39 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              pauVar44 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                auVar80 = *(undefined1 (*) [16])
                           ((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                uVar56 = uVar45;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar69 = maxps(*pauVar46,auVar80);
                  *pauVar44 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar44 = pauVar44 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar48 ^ 1) == 0 && (uVar54 ^ uVar45) == 0) && uVar36 == 0) && uVar56 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar56 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              pvVar47 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  auVar80 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37),
                                  *(undefined1 (*) [16])((long)pvVar47 + lVar53));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar80;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar45 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar56,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar54 < 1) {
              uVar54 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              pauVar46 = (undefined1 (*) [16])
                         (a[1].cstep * uVar39 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                auVar80 = *(undefined1 (*) [16])
                           ((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                uVar45 = uVar54;
                while (bVar59 = uVar45 != 0, uVar45 = uVar45 - 1, bVar59) {
                  auVar69 = maxps(*pauVar46,auVar80);
                  *pauVar44 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar44 = pauVar44 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ uVar45) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) && uVar48 != 1) {
          Mat::create(this_00,uVar45,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              pvVar47 = (void *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              for (uVar56 = 0; uVar56 != uVar48; uVar56 = uVar56 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  auVar80 = maxps(*(undefined1 (*) [16])((long)pvVar47 + lVar53),
                                  *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar80;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0036a6ca;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                auVar80 = *pauVar46;
                uVar56 = uVar54;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar69 = maxps(*pauVar44,auVar80);
                  *pauVar52 = auVar69;
                  pauVar44 = pauVar44 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])
                       ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar44;
              uVar54 = uVar45;
              while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                auVar69 = maxps(*pauVar46,auVar80);
                *pauVar52 = auVar69;
                pauVar46 = pauVar46 + 1;
                pauVar52 = pauVar52 + 1;
              }
              pauVar44 = pauVar44 + 1;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          auVar80 = *(undefined1 (*) [16])((long)a[1].data + uVar37 * 0x10);
          pvVar8 = a->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            auVar69 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37),
                            auVar80);
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37) = auVar69;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_0036a6ca;
      Mat::create(this_00,uVar45,uVar56,iVar3,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar44;
                uVar54 = uVar45;
                while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                  auVar69 = maxps(*pauVar46,auVar80);
                  *pauVar52 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar44 = pauVar44 + 1;
              }
            }
          }
          return 0;
        }
        if (iVar34 == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])
                       ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              auVar80 = *pauVar44;
              for (uVar35 = 0; uVar54 = uVar45, uVar35 != uVar56; uVar35 = uVar35 + 1) {
                while (uVar54 != 0) {
                  auVar69 = maxps(*pauVar46,auVar80);
                  *pauVar52 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar54 = uVar54 - 1;
                }
              }
              pauVar44 = pauVar44 + 1;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = this_00->cstep;
          sVar9 = this_00->elemsize;
          pvVar8 = this_00->data;
          auVar80 = *(undefined1 (*) [16])((long)a[1].data + uVar37 * 0x10);
          sVar10 = a->elemsize;
          pvVar47 = a->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            auVar69 = maxps(*(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37)
                            ,auVar80);
            *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37) = auVar69;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_0036f523:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_max>(a,b,this_00,opt);
    return iVar34;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar45 = a->w;
    uVar56 = a->h;
    iVar3 = a->d;
    uVar35 = a->c;
    uVar38 = (ulong)uVar35;
    iVar43 = uVar56 * uVar45 * iVar3;
    sVar5 = a->elemsize;
    uVar54 = a[1].w;
    uVar48 = a[1].h;
    iVar49 = a[1].d;
    uVar4 = a[1].c;
    uVar37 = (ulong)uVar4;
    iVar42 = uVar48 * uVar54 * iVar49;
    sVar6 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar45 == 1) {
        Mat::create_like(this_00,b,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pvVar8 = a[1].data;
            fVar1 = *a->data;
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pauVar44 = (undefined1 (*) [16])(sVar5 * uVar38 * sVar6 + (long)pvVar8);
            pvVar47 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar46 = (undefined1 (*) [16])(sVar10 * uVar38 * sVar9 + (long)pvVar47);
            auVar62._4_4_ = fVar1;
            auVar62._0_4_ = fVar1;
            auVar62._8_4_ = fVar1;
            auVar62._12_4_ = fVar1;
            lVar53 = 0;
            for (iVar34 = 0; iVar34 + 3 < iVar42 * _elempack; iVar34 = iVar34 + 4) {
              auVar80 = minps(*pauVar44,auVar62);
              *pauVar46 = auVar80;
              pauVar44 = pauVar44 + 1;
              pauVar46 = pauVar46 + 1;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar42 * _elempack; lVar53 = lVar53 + 1) {
              fVar60 = *(float *)((long)pvVar8 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
              if (fVar1 <= fVar60) {
                fVar60 = fVar1;
              }
              *(float *)((long)pvVar47 + lVar53 * 4 + sVar10 * sVar9 * uVar38) = fVar60;
            }
          }
          return 0;
        }
        return -100;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0036ba86_caseD_1;
      case 2:
        Mat::create(this_00,uVar54,uVar48,sVar6,_elempack,opt->blob_allocator);
        pauVar46 = (undefined1 (*) [16])this_00->data;
        if (pauVar46 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          pauVar44 = (undefined1 (*) [16])a->data;
          pauVar52 = (undefined1 (*) [16])a[1].data;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
            auVar80 = *pauVar44;
            uVar56 = uVar54;
            while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
              auVar69 = minps(*pauVar52,auVar80);
              *pauVar46 = auVar69;
              pauVar52 = pauVar52 + 1;
              pauVar46 = pauVar46 + 1;
            }
            pauVar44 = pauVar44 + 1;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            auVar80 = *(undefined1 (*) [16])((long)a->data + uVar38 * 0x10);
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              auVar69 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38)
                              ,auVar80);
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar69;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar42 < 1) {
            iVar42 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            auVar80 = *(undefined1 (*) [16])((long)a->data + uVar38 * 0x10);
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar42;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              auVar69 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38)
                              ,auVar80);
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar69;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
              auVar80 = *pauVar46;
              uVar56 = uVar54;
              while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                auVar69 = minps(*pauVar44,auVar80);
                *pauVar52 = auVar69;
                pauVar44 = pauVar44 + 1;
                pauVar52 = pauVar52 + 1;
              }
              pauVar46 = pauVar46 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              auVar80 = *pauVar46;
              for (uVar45 = 0; uVar56 = uVar54, uVar45 != uVar48; uVar45 = uVar45 + 1) {
                while (uVar56 != 0) {
                  auVar69 = minps(*pauVar44,auVar80);
                  *pauVar52 = auVar69;
                  pauVar44 = pauVar44 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar56 = uVar56 - 1;
                }
              }
              pauVar46 = pauVar46 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
LAB_0036af20:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>(a,b,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,opt->blob_allocator);
      pauVar46 = (undefined1 (*) [16])this_00->data;
      if (pauVar46 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || a[1].w != 1) {
        pauVar44 = (undefined1 (*) [16])a->data;
        pauVar52 = (undefined1 (*) [16])a[1].data;
        if ((int)uVar45 < 1) {
          uVar45 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar56 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
          auVar80 = *pauVar52;
          uVar54 = uVar45;
          while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
            auVar69 = minps(*pauVar44,auVar80);
            *pauVar46 = auVar69;
            pauVar44 = pauVar44 + 1;
            pauVar46 = pauVar46 + 1;
          }
          pauVar52 = pauVar52 + 1;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar36 = uVar4 ^ uVar35;
        if (((uVar54 ^ 1) == 0 && (uVar48 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a->cstep;
              sVar9 = a->elemsize;
              pvVar8 = a->data;
              auVar80 = *(undefined1 (*) [16])
                         ((long)a[1].data + a[1].cstep * uVar37 * a[1].elemsize);
              sVar10 = this_00->elemsize;
              pvVar47 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                auVar69 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37),auVar80);
                *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37) = auVar69;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar54 == uVar45) && (_elempack == 1 && (uVar4 == 1 && uVar48 == uVar56))) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a[1].data;
              pvVar47 = a->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                uVar2 = *(undefined4 *)((long)pvVar8 + lVar53);
                auVar79._4_4_ = uVar2;
                auVar79._0_4_ = uVar2;
                auVar79._8_4_ = uVar2;
                auVar79._12_4_ = uVar2;
                auVar80 = minps(auVar79,*(undefined1 (*) [16])
                                         ((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar37));
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar37) =
                     auVar80;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar45 ^ 1) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar54,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = this_00->elemsize;
              sVar9 = a[1].cstep;
              pvVar8 = this_00->data;
              auVar80 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar37 * a->elemsize);
              sVar10 = a[1].elemsize;
              pvVar47 = a[1].data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                auVar69 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37),auVar80);
                *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37) = auVar69;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar54 == uVar45) && (iVar34 == 1)) && ((uVar48 == uVar56 && (uVar35 == 1)))) {
          Mat::create(this_00,uVar45,uVar56,uVar4,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a->data;
              pvVar47 = a[1].data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                uVar2 = *(undefined4 *)((long)pvVar8 + lVar53);
                auVar27._4_4_ = uVar2;
                auVar27._0_4_ = uVar2;
                auVar27._8_4_ = uVar2;
                auVar27._12_4_ = uVar2;
                auVar80 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38),auVar27);
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar80;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar45 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              pauVar46 = (undefined1 (*) [16])(a->cstep * uVar39 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              pauVar44 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                auVar80 = *(undefined1 (*) [16])
                           ((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                uVar56 = uVar45;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar69 = minps(*pauVar46,auVar80);
                  *pauVar44 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar44 = pauVar44 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar48 ^ 1) == 0 && (uVar54 ^ uVar45) == 0) && uVar36 == 0) && uVar56 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar56 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              pvVar47 = (void *)(a->cstep * uVar37 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  auVar80 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37),
                                  *(undefined1 (*) [16])((long)pvVar47 + lVar53));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar80;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar45 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar56,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar54 < 1) {
              uVar54 = 0;
            }
            uVar37 = (ulong)uVar56;
            if ((int)uVar56 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar38; uVar39 = uVar39 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              pauVar46 = (undefined1 (*) [16])
                         (a[1].cstep * uVar39 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar37; uVar41 = uVar41 + 1) {
                auVar80 = *(undefined1 (*) [16])
                           ((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                uVar45 = uVar54;
                while (bVar59 = uVar45 != 0, uVar45 = uVar45 - 1, bVar59) {
                  auVar69 = minps(*pauVar46,auVar80);
                  *pauVar44 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar44 = pauVar44 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ uVar45) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) && uVar48 != 1) {
          Mat::create(this_00,uVar45,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar38 = 0;
            }
            for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
              sVar5 = a->cstep;
              pvVar47 = (void *)(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              for (uVar56 = 0; uVar56 != uVar48; uVar56 = uVar56 + 1) {
                for (lVar53 = 0; (ulong)uVar45 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  auVar80 = minps(*(undefined1 (*) [16])((long)pvVar47 + lVar53),
                                  *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar80;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0036af20;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                auVar80 = *pauVar46;
                uVar56 = uVar54;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  auVar69 = minps(*pauVar44,auVar80);
                  *pauVar52 = auVar69;
                  pauVar44 = pauVar44 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])
                       ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar44;
              uVar54 = uVar45;
              while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                auVar69 = minps(*pauVar46,auVar80);
                *pauVar52 = auVar69;
                pauVar46 = pauVar46 + 1;
                pauVar52 = pauVar52 + 1;
              }
              pauVar44 = pauVar44 + 1;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          auVar80 = *(undefined1 (*) [16])((long)a[1].data + uVar37 * 0x10);
          pvVar8 = a->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            auVar69 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar37),
                            auVar80);
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar37) = auVar69;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_0036af20;
      Mat::create(this_00,uVar45,uVar56,iVar3,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])(a[1].cstep * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar44;
                uVar54 = uVar45;
                while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                  auVar69 = minps(*pauVar46,auVar80);
                  *pauVar52 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar44 = pauVar44 + 1;
              }
            }
          }
          return 0;
        }
        if (iVar34 == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar38 = 0;
          }
          for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
            pauVar46 = (undefined1 (*) [16])(a->cstep * uVar37 * a->elemsize + (long)a->data);
            pauVar44 = (undefined1 (*) [16])
                       ((long)a[1].w * uVar37 * a[1].elemsize + (long)a[1].data);
            pauVar52 = (undefined1 (*) [16])
                       (this_00->cstep * uVar37 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              auVar80 = *pauVar44;
              for (uVar35 = 0; uVar54 = uVar45, uVar35 != uVar56; uVar35 = uVar35 + 1) {
                while (uVar54 != 0) {
                  auVar69 = minps(*pauVar46,auVar80);
                  *pauVar52 = auVar69;
                  pauVar46 = pauVar46 + 1;
                  pauVar52 = pauVar52 + 1;
                  uVar54 = uVar54 - 1;
                }
              }
              pauVar44 = pauVar44 + 1;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar38 = 0;
        }
        for (uVar37 = 0; uVar37 != uVar38; uVar37 = uVar37 + 1) {
          sVar5 = a->cstep;
          sVar6 = this_00->cstep;
          sVar9 = this_00->elemsize;
          pvVar8 = this_00->data;
          auVar80 = *(undefined1 (*) [16])((long)a[1].data + uVar37 * 0x10);
          sVar10 = a->elemsize;
          pvVar47 = a->data;
          lVar53 = 0;
          iVar34 = iVar43;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            auVar69 = minps(*(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar37)
                            ,auVar80);
            *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar37) = auVar69;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_0036f683:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_min>(a,b,this_00,opt);
    return iVar34;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar45 = a->w;
    uVar41 = (ulong)uVar45;
    uVar56 = a->h;
    uVar38 = (ulong)uVar56;
    iVar3 = a->d;
    uVar35 = a->c;
    uVar37 = (ulong)uVar35;
    iVar42 = uVar56 * uVar45 * iVar3;
    sVar5 = a->elemsize;
    uVar54 = a[1].w;
    uVar48 = a[1].h;
    iVar49 = a[1].d;
    uVar4 = a[1].c;
    uVar39 = (ulong)uVar4;
    iVar43 = uVar48 * uVar54 * iVar49;
    sVar6 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar45 == 1) {
        Mat::create_like(this_00,b,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            pvVar8 = a[1].data;
            fVar1 = *a->data;
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pfVar57 = (float *)(sVar5 * uVar38 * sVar6 + (long)pvVar8);
            pvVar47 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar46 = (undefined1 (*) [16])(sVar10 * uVar38 * sVar9 + (long)pvVar47);
            _a0[1] = fVar1;
            _a0[0] = fVar1;
            _a0[3] = fVar1;
            _a0[2] = fVar1;
            lVar53 = 0;
            for (iVar34 = 0; iVar34 + 3 < iVar43 * _elempack; iVar34 = iVar34 + 4) {
              _p1._0_8_ = *(undefined8 *)pfVar57;
              _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
              afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
              auVar26._8_4_ = extraout_XMM0_Dc;
              auVar26._0_8_ = afVar109._0_8_;
              auVar26._12_4_ = extraout_XMM0_Dd;
              *pauVar46 = auVar26;
              pfVar57 = pfVar57 + 4;
              pauVar46 = pauVar46 + 1;
              lVar53 = lVar53 + 4;
            }
            for (; (int)lVar53 < iVar43 * _elempack; lVar53 = lVar53 + 1) {
              fVar60 = powf(fVar1,*(float *)((long)pvVar8 + lVar53 * 4 + sVar5 * sVar6 * uVar38));
              *(float *)((long)pvVar47 + lVar53 * 4 + sVar10 * sVar9 * uVar38) = fVar60;
            }
          }
          return 0;
        }
        return -100;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0036bb10_caseD_1;
      case 2:
        Mat::create(this_00,uVar54,uVar48,sVar6,_elempack,opt->blob_allocator);
        pauVar46 = (undefined1 (*) [16])this_00->data;
        if (pauVar46 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          pfVar57 = (float *)a->data;
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          pfVar58 = (float *)a[1].data;
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
            _a0._0_8_ = *(undefined8 *)pfVar57;
            _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
            uVar56 = uVar54;
            while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
              _p1._0_8_ = *(undefined8 *)pfVar58;
              _p1._8_8_ = *(undefined8 *)(pfVar58 + 2);
              afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
              auVar31._8_4_ = extraout_XMM0_Dc_10;
              auVar31._0_8_ = afVar109._0_8_;
              auVar31._12_4_ = extraout_XMM0_Dd_10;
              *pauVar46 = auVar31;
              pfVar58 = pfVar58 + 4;
              pauVar46 = pauVar46 + 1;
            }
            pfVar57 = pfVar57 + 4;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar43 < 1) {
            iVar43 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            _a0._0_8_ = *(undefined8 *)pfVar57;
            _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar43;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              _p1._0_8_ = *(undefined8 *)pfVar57;
              _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
              afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
              auVar30._8_4_ = extraout_XMM0_Dc_08;
              auVar30._0_8_ = afVar109._0_8_;
              auVar30._12_4_ = extraout_XMM0_Dd_08;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar30;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (iVar43 < 1) {
            iVar43 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->data + uVar38 * 0x10);
            _a0._0_8_ = *(undefined8 *)pfVar57;
            _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
            sVar5 = a[1].cstep;
            sVar6 = a[1].elemsize;
            pvVar8 = a[1].data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar47 = this_00->data;
            lVar53 = 0;
            iVar34 = iVar43;
            while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
              pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
              _p1._0_8_ = *(undefined8 *)pfVar57;
              _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
              afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
              auVar29._8_4_ = extraout_XMM0_Dc_09;
              auVar29._0_8_ = afVar109._0_8_;
              auVar29._12_4_ = extraout_XMM0_Dd_09;
              *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar29;
              lVar53 = lVar53 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar7 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar54,uVar48,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
              _a0._0_8_ = *(undefined8 *)pfVar57;
              _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
              uVar56 = uVar54;
              while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                _p1._0_8_ = *(undefined8 *)pfVar58;
                _p1._8_8_ = *(undefined8 *)(pfVar58 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                auVar25._8_4_ = extraout_XMM0_Dc_04;
                auVar25._0_8_ = afVar109._0_8_;
                auVar25._12_4_ = extraout_XMM0_Dd_04;
                *pauVar46 = auVar25;
                pfVar58 = pfVar58 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar57 = pfVar57 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,pAVar7);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            local_88 = (float *)((long)a->w * uVar38 * a->elemsize + (long)a->data);
            pfVar57 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              _a0._0_8_ = *(undefined8 *)local_88;
              _a0._8_8_ = *(undefined8 *)(local_88 + 2);
              for (uVar45 = 0; uVar56 = uVar54, uVar45 != uVar48; uVar45 = uVar45 + 1) {
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                  auVar23._8_4_ = extraout_XMM0_Dc_01;
                  auVar23._0_8_ = afVar109._0_8_;
                  auVar23._12_4_ = extraout_XMM0_Dd_01;
                  *pauVar46 = auVar23;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
              local_88 = local_88 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,pAVar7);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
LAB_0036af49:
        iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>(a,b,this_00,opt);
        return iVar34;
      }
      Mat::create(this_00,uVar45,uVar56,sVar5,iVar34,opt->blob_allocator);
      pauVar46 = (undefined1 (*) [16])this_00->data;
      if (pauVar46 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || a[1].w != 1) {
        pfVar57 = (float *)a->data;
        if ((int)uVar45 < 1) {
          uVar41 = 0;
        }
        pfVar58 = (float *)a[1].data;
        if ((int)uVar56 < 1) {
          uVar56 = 0;
        }
        for (uVar45 = 0; uVar45 != uVar56; uVar45 = uVar45 + 1) {
          _a0._0_8_ = *(undefined8 *)pfVar58;
          _a0._8_8_ = *(undefined8 *)(pfVar58 + 2);
          uVar38 = uVar41;
          while (iVar34 = (int)uVar38, uVar38 = (ulong)(iVar34 - 1), iVar34 != 0) {
            _p1._0_8_ = *(undefined8 *)pfVar57;
            _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
            afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
            auVar24._8_4_ = extraout_XMM0_Dc_18;
            auVar24._0_8_ = afVar109._0_8_;
            auVar24._12_4_ = extraout_XMM0_Dd_18;
            *pauVar46 = auVar24;
            pfVar57 = pfVar57 + 4;
            pauVar46 = pauVar46 + 1;
          }
          pfVar58 = pfVar58 + 4;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar36 = uVar4 ^ uVar35;
        if (((uVar54 ^ 1) == 0 && (uVar48 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a->cstep;
              sVar9 = a->elemsize;
              pvVar8 = a->data;
              sVar10 = this_00->elemsize;
              pvVar47 = this_00->data;
              pfVar57 = (float *)((long)a[1].data + a[1].cstep * uVar38 * a[1].elemsize);
              _a0._0_8_ = *(undefined8 *)pfVar57;
              _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar6 * sVar9 * uVar38);
                _p1._0_8_ = *(undefined8 *)pfVar57;
                _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
                auVar15._8_4_ = extraout_XMM0_Dc_03;
                auVar15._0_8_ = afVar109._0_8_;
                auVar15._12_4_ = extraout_XMM0_Dd_03;
                *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar5 * sVar10 * uVar38) = auVar15;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar54 == uVar45) && (_elempack == 1 && (uVar4 == 1 && uVar48 == uVar56))) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar42 < 1) {
              iVar42 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a[1].data;
              pvVar47 = a->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar42;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
                _a0._0_8_ = *(undefined8 *)pfVar57;
                _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
                _p1[1] = *(float *)((long)pvVar8 + lVar53);
                _p1[0] = _p1[1];
                _p1[3] = _p1[1];
                _p1[2] = _p1[1];
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                auVar16._8_4_ = extraout_XMM0_Dc_06;
                auVar16._0_8_ = afVar109._0_8_;
                auVar16._12_4_ = extraout_XMM0_Dd_06;
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar16;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar45 ^ 1) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) {
          Mat::create(this_00,uVar54,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              sVar5 = this_00->cstep;
              sVar6 = a[1].cstep;
              sVar9 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar10 = a[1].elemsize;
              pvVar47 = a[1].data;
              pfVar57 = (float *)((long)a->data + a->cstep * uVar38 * a->elemsize);
              _a0._0_8_ = *(undefined8 *)pfVar57;
              _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                pfVar57 = (float *)((long)pvVar47 + lVar53 + sVar6 * sVar10 * uVar38);
                _p1._0_8_ = *(undefined8 *)pfVar57;
                _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                auVar17._8_4_ = extraout_XMM0_Dc_07;
                auVar17._0_8_ = afVar109._0_8_;
                auVar17._12_4_ = extraout_XMM0_Dd_07;
                *(undefined1 (*) [16])((long)pvVar8 + lVar53 + sVar5 * sVar9 * uVar38) = auVar17;
                lVar53 = lVar53 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 == uVar45) && (iVar34 == 1)) && (uVar48 == uVar56)) && (uVar35 == 1)) {
          Mat::create(this_00,uVar45,uVar56,uVar4,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (iVar43 < 1) {
              iVar43 = 0;
            }
            if ((int)uVar4 < 1) {
              uVar39 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a->data;
              pvVar47 = a[1].data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar53 = 0;
              iVar34 = iVar43;
              while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
                _a0[1] = *(float *)((long)pvVar8 + lVar53);
                _a0[0] = _a0[1];
                _a0[3] = _a0[1];
                _a0[2] = _a0[1];
                pfVar57 = (float *)((long)pvVar47 + lVar53 * 4 + sVar5 * sVar6 * uVar38);
                _p1._0_8_ = *(undefined8 *)pfVar57;
                _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                auVar18._8_4_ = extraout_XMM0_Dc_11;
                auVar18._0_8_ = afVar109._0_8_;
                auVar18._12_4_ = extraout_XMM0_Dd_11;
                *(undefined1 (*) [16])((long)pvVar55 + lVar53 * 4 + sVar9 * sVar10 * uVar38) =
                     auVar18;
                lVar53 = lVar53 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar45 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar41 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar38 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar37; uVar39 = uVar39 + 1) {
              pfVar57 = (float *)(a->cstep * uVar39 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar40 * 0x10 + sVar5 * uVar39 * sVar6);
                _a0._0_8_ = *(undefined8 *)pfVar58;
                _a0._8_8_ = *(undefined8 *)(pfVar58 + 2);
                uVar50 = uVar41;
                while (iVar34 = (int)uVar50, uVar50 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
                  auVar19._8_4_ = extraout_XMM0_Dc_14;
                  auVar19._0_8_ = afVar109._0_8_;
                  auVar19._12_4_ = extraout_XMM0_Dd_14;
                  *pauVar46 = auVar19;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar48 ^ 1) == 0 && (uVar54 ^ uVar45) == 0) && uVar36 == 0) && uVar56 != 1) {
          Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar41 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar56 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
              pvVar55 = (void *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
              sVar5 = a[1].cstep;
              pvVar47 = (void *)(this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
              sVar6 = a[1].elemsize;
              pvVar8 = a[1].data;
              for (uVar45 = 0; uVar45 != uVar56; uVar45 = uVar45 + 1) {
                for (lVar53 = 0; uVar41 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  _a0._0_8_ = *(undefined8 *)((long)pvVar55 + lVar53);
                  _a0._8_8_ = *(undefined8 *)((float *)((long)pvVar55 + lVar53) + 2);
                  pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                  auVar20._8_4_ = extraout_XMM0_Dc_15;
                  auVar20._0_8_ = afVar109._0_8_;
                  auVar20._12_4_ = extraout_XMM0_Dd_15;
                  *(undefined1 (*) [16])((long)pvVar47 + lVar53) = auVar20;
                }
                pvVar55 = (void *)((long)pvVar55 + lVar53);
                pvVar47 = (void *)((long)pvVar47 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar45 ^ 1) == 0 && (uVar48 ^ uVar56) == 0) && uVar36 == 0) && uVar54 != 1) {
          Mat::create(this_00,uVar54,uVar56,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar54 < 1) {
              uVar54 = 0;
            }
            if ((int)uVar56 < 1) {
              uVar38 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar37 = 0;
            }
            for (uVar39 = 0; uVar39 != uVar37; uVar39 = uVar39 + 1) {
              sVar5 = a->cstep;
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              pfVar57 = (float *)(a[1].cstep * uVar39 * a[1].elemsize + (long)a[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (this_00->cstep * uVar39 * this_00->elemsize + (long)this_00->data);
              for (uVar41 = 0; uVar41 != uVar38; uVar41 = uVar41 + 1) {
                pfVar58 = (float *)((long)pvVar8 + uVar41 * 0x10 + sVar5 * uVar39 * sVar6);
                _a0._0_8_ = *(undefined8 *)pfVar58;
                _a0._8_8_ = *(undefined8 *)(pfVar58 + 2);
                uVar45 = uVar54;
                while (bVar59 = uVar45 != 0, uVar45 = uVar45 - 1, bVar59) {
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                  auVar21._8_4_ = extraout_XMM0_Dc_17;
                  auVar21._0_8_ = afVar109._0_8_;
                  auVar21._12_4_ = extraout_XMM0_Dd_17;
                  *pauVar46 = auVar21;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar54 ^ uVar45) == 0 && (uVar56 ^ 1) == 0) && uVar36 == 0) && uVar48 != 1) {
          Mat::create(this_00,uVar45,uVar48,uVar35,sVar6,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar45 < 1) {
              uVar41 = 0;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            for (uVar38 = 0; uVar38 != uVar35; uVar38 = uVar38 + 1) {
              sVar5 = a->cstep;
              pvVar47 = (void *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
              sVar6 = a->elemsize;
              pvVar8 = a->data;
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                for (lVar53 = 0; uVar41 * 0x10 != lVar53; lVar53 = lVar53 + 0x10) {
                  pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
                  _a0._0_8_ = *(undefined8 *)pfVar57;
                  _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  _p1._0_8_ = *(undefined8 *)((long)pvVar47 + lVar53);
                  _p1._8_8_ = *(undefined8 *)((float *)((long)pvVar47 + lVar53) + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                  auVar22._8_4_ = extraout_XMM0_Dc_19;
                  auVar22._0_8_ = afVar109._0_8_;
                  auVar22._12_4_ = extraout_XMM0_Dd_19;
                  *(undefined1 (*) [16])((long)pvVar55 + lVar53) = auVar22;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar53);
                pvVar55 = (void *)((long)pvVar55 + lVar53);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_0036af49;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar54,uVar48,iVar49,uVar4,sVar6,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          if (iVar49 < 1) {
            iVar49 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar39 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
            local_b0 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pfVar57 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar49; iVar34 = iVar34 + 1) {
              for (uVar45 = 0; uVar45 != uVar48; uVar45 = uVar45 + 1) {
                _a0._0_8_ = *(undefined8 *)local_b0;
                _a0._8_8_ = *(undefined8 *)(local_b0 + 2);
                uVar56 = uVar54;
                while (bVar59 = uVar56 != 0, uVar56 = uVar56 - 1, bVar59) {
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_a0,&_p1);
                  auVar12._8_4_ = extraout_XMM0_Dc_00;
                  auVar12._0_8_ = afVar109._0_8_;
                  auVar12._12_4_ = extraout_XMM0_Dd_00;
                  *pauVar46 = auVar12;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                local_b0 = local_b0 + 4;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar45,uVar56,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar45 < 1) {
            uVar41 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pfVar58 = (float *)((long)a[1].w * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (uVar45 = 0; uVar45 != uVar56; uVar45 = uVar45 + 1) {
              _a0._0_8_ = *(undefined8 *)pfVar58;
              _a0._8_8_ = *(undefined8 *)(pfVar58 + 2);
              uVar39 = uVar41;
              while (iVar34 = (int)uVar39, uVar39 = (ulong)(iVar34 - 1), iVar34 != 0) {
                _p1._0_8_ = *(undefined8 *)pfVar57;
                _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
                auVar13._8_4_ = extraout_XMM0_Dc_05;
                auVar13._0_8_ = afVar109._0_8_;
                auVar13._12_4_ = extraout_XMM0_Dd_05;
                *pauVar46 = auVar13;
                pfVar57 = pfVar57 + 4;
                pauVar46 = pauVar46 + 1;
              }
              pfVar58 = pfVar58 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar42 < 1) {
          iVar42 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar37 = 0;
        }
        for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          pvVar8 = a->data;
          pfVar57 = (float *)((long)a[1].data + uVar38 * 0x10);
          _a0._0_8_ = *(undefined8 *)pfVar57;
          _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar42;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
            _p1._0_8_ = *(undefined8 *)pfVar57;
            _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
            afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
            auVar14._8_4_ = extraout_XMM0_Dc_16;
            auVar14._0_8_ = afVar109._0_8_;
            auVar14._12_4_ = extraout_XMM0_Dd_16;
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar14;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_0036af49;
      Mat::create(this_00,uVar45,uVar56,iVar3,uVar35,sVar5,iVar34,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar58 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            pfVar57 = (float *)(a[1].cstep * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                _a0._0_8_ = *(undefined8 *)pfVar57;
                _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
                uVar54 = uVar45;
                while (bVar59 = uVar54 != 0, uVar54 = uVar54 - 1, bVar59) {
                  _p1._0_8_ = *(undefined8 *)pfVar58;
                  _p1._8_8_ = *(undefined8 *)(pfVar58 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
                  auVar80._8_4_ = extraout_XMM0_Dc_12;
                  auVar80._0_8_ = afVar109._0_8_;
                  auVar80._12_4_ = extraout_XMM0_Dd_12;
                  *pauVar46 = auVar80;
                  pfVar58 = pfVar58 + 4;
                  pauVar46 = pauVar46 + 1;
                }
                pfVar57 = pfVar57 + 4;
              }
            }
          }
          return 0;
        }
        if (iVar34 == 2) {
          if ((int)uVar45 < 1) {
            uVar45 = 0;
          }
          if ((int)uVar56 < 1) {
            uVar56 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if ((int)uVar35 < 1) {
            uVar37 = 0;
          }
          for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
            pfVar57 = (float *)(a->cstep * uVar38 * a->elemsize + (long)a->data);
            local_90 = (float *)((long)a[1].w * uVar38 * a[1].elemsize + (long)a[1].data);
            pauVar46 = (undefined1 (*) [16])
                       (this_00->cstep * uVar38 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != iVar3; iVar34 = iVar34 + 1) {
              _a0._0_8_ = *(undefined8 *)local_90;
              _a0._8_8_ = *(undefined8 *)(local_90 + 2);
              for (uVar35 = 0; uVar54 = uVar45, uVar35 != uVar56; uVar35 = uVar35 + 1) {
                while (uVar54 != 0) {
                  _p1._0_8_ = *(undefined8 *)pfVar57;
                  _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
                  afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
                  auVar69._8_4_ = extraout_XMM0_Dc_02;
                  auVar69._0_8_ = afVar109._0_8_;
                  auVar69._12_4_ = extraout_XMM0_Dd_02;
                  *pauVar46 = auVar69;
                  pfVar57 = pfVar57 + 4;
                  pauVar46 = pauVar46 + 1;
                  uVar54 = uVar54 - 1;
                }
              }
              local_90 = local_90 + 4;
            }
          }
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || a[1].w != 1) {
        if (iVar42 < 1) {
          iVar42 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar37 = 0;
        }
        for (uVar38 = 0; uVar38 != uVar37; uVar38 = uVar38 + 1) {
          sVar5 = a->cstep;
          sVar6 = a->elemsize;
          pvVar8 = a->data;
          pfVar57 = (float *)((long)a[1].data + uVar38 * 0x10);
          _a0._0_8_ = *(undefined8 *)pfVar57;
          _a0._8_8_ = *(undefined8 *)(pfVar57 + 2);
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          pvVar47 = this_00->data;
          lVar53 = 0;
          iVar34 = iVar42;
          while (bVar59 = iVar34 != 0, iVar34 = iVar34 + -1, bVar59) {
            pfVar57 = (float *)((long)pvVar8 + lVar53 + sVar5 * sVar6 * uVar38);
            _p1._0_8_ = *(undefined8 *)pfVar57;
            _p1._8_8_ = *(undefined8 *)(pfVar57 + 2);
            afVar109 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p1,&_a0);
            auVar11._8_4_ = extraout_XMM0_Dc_13;
            auVar11._0_8_ = afVar109._0_8_;
            auVar11._12_4_ = extraout_XMM0_Dd_13;
            *(undefined1 (*) [16])((long)pvVar47 + lVar53 + sVar9 * sVar10 * uVar38) = auVar11;
            lVar53 = lVar53 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_0036f7d7:
    iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_pow>(a,b,this_00,opt);
    return iVar34;
  case 7:
    pMVar51 = a;
    a = b;
    break;
  case 8:
    pMVar51 = a;
    a = b;
LAB_0036a58a:
    iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_div>(a,pMVar51,this_00,opt);
    return iVar34;
  }
  iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_functor::binary_op_sub>(a,pMVar51,this_00,opt);
  return iVar34;
switchD_0036bb10_caseD_1:
  Mat::create(this_00,uVar45,sVar5,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (_elempack != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_0036f7d7;
switchD_0036ba86_caseD_1:
  Mat::create(this_00,uVar45,sVar5,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (_elempack != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_0036f683;
switchD_0036b33e_caseD_1:
  Mat::create(this_00,uVar45,sVar5,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (_elempack != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_max>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_0036f523;
switchD_0036b515_caseD_1:
  Mat::create(this_00,uVar45,sVar5,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (_elempack != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_0036f5b6;
switchD_0036b6ec_caseD_1:
  Mat::create(this_00,uVar45,sVar5,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (_elempack != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_0036f5ed;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}